

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

bool wallet::GetWalletNameFromJSONRPCRequest(JSONRPCRequest *request,string *wallet_name)

{
  bool bVar1;
  long in_FS_OFFSET;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2._M_str = WALLET_ENDPOINT_BASE_abi_cxx11_;
  bVar2._M_len = DAT_006448e8;
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          starts_with((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &request->URI,bVar2);
  if (bVar1) {
    local_50._M_str = (request->URI)._M_dataplus._M_p;
    local_50._M_len = (request->URI)._M_string_length;
    bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                      (&local_50,DAT_006448e8,0xffffffffffffffff);
    UrlDecode_abi_cxx11_(&local_40,bVar2);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (wallet_name,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool GetWalletNameFromJSONRPCRequest(const JSONRPCRequest& request, std::string& wallet_name)
{
    if (request.URI.starts_with(WALLET_ENDPOINT_BASE)) {
        // wallet endpoint was used
        wallet_name = UrlDecode(std::string_view{request.URI}.substr(WALLET_ENDPOINT_BASE.size()));
        return true;
    }
    return false;
}